

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
ShowModsIRCCommand::trigger
          (ShowModsIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  Server *source_00;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  size_t local_98;
  char *local_90;
  Server *server;
  uint i;
  bool sent;
  int type;
  Channel *chan;
  IRC_Bot *source_local;
  ShowModsIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  lVar2 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
  if (lVar2 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    bVar1 = false;
    server._4_4_ = 0;
    while( true ) {
      RenX::getCore();
      uVar3 = RenX::Core::getServerCount();
      if (server._4_4_ == uVar3) break;
      uVar3 = RenX::getCore();
      source_00 = (Server *)RenX::Core::getServer(uVar3);
      uVar3 = RenX::Server::isLogChanType((int)source_00);
      if ((uVar3 & 1) != 0) {
        bVar4 = sv("",0);
        ModsGameCommand::trigger(&ModsGameCommand_instance,source_00,(PlayerInfo *)0x0,bVar4);
        bVar1 = true;
      }
      server._4_4_ = server._4_4_ + 1;
    }
    if (!bVar1) {
      bVar4 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
      local_98 = bVar4._M_len;
      local_90 = bVar4._M_str;
      Jupiter::IRC::Client::sendMessage(source,channel._M_len,channel._M_str,local_98,local_90);
    }
  }
  return;
}

Assistant:

void ShowModsIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr)
	{
		int type = chan->getType();
		bool sent = false;
		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
		{
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type))
			{
				ModsGameCommand_instance.trigger(server, nullptr, ""sv);
				sent = true;
			}
		}
		if (sent == false)
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}